

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::EnergyScan
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  function<void_(ot::commissioner::Error)> *this_00;
  char *begin;
  char *pcVar4;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar6;
  format_args args;
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  parse_func local_1f0 [1];
  undefined1 local_1e0 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  undefined4 local_1b8;
  undefined4 local_1b4;
  Error error;
  Address dstAddr;
  ByteArray channelMask;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  string local_120;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  undefined1 local_58 [40];
  
  aVar5._2_6_ = in_register_0000008a;
  aVar5._0_2_ = aScanDuration;
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aVar6 = aVar5;
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  local_1b4 = (undefined4)CONCAT62(in_register_00000082,aPeriod);
  local_1b8 = aVar5._0_4_;
  Address::Set((Error *)local_218,&dstAddr,aDstAddr);
  pEVar3 = Error::operator=(&error,(Error *)local_218);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)&local_210);
  if (EVar1 == kNone) {
    if ((dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (*dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xff)) {
      request.mHeader._0_1_ = request.mHeader._0_1_ & 0xf3 | 4;
    }
    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
    if ((char)iVar2 == '\0') {
      local_218._0_4_ = none_type;
      local_210._M_p = "the commissioner is not active";
      local_208 = 0x1e;
      local_200._M_allocated_capacity = 0;
      local_1f0[0] = (parse_func)0x0;
      pcVar4 = "the commissioner is not active";
      local_200._8_8_ = local_218;
      while (begin = pcVar4, begin != "") {
        pcVar4 = begin + 1;
        if (*begin == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (begin,"",(format_string_checker<char> *)local_218);
        }
      }
      args.field_1.args_ = aVar6.args_;
      args.desc_ = (unsigned_long_long)local_218;
      ::fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
      local_1e0._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_1d8,(string *)&local_120);
      Error::operator=(&error,(Error *)local_1e0);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      std::__cxx11::string::string((string *)local_1e0,"/c/es",(allocator *)&local_120);
      coap::Message::SetUriPath((Error *)local_218,&request,(string *)local_1e0);
      pEVar3 = Error::operator=(&error,(Error *)local_218);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)local_1e0);
      if (EVar1 == kNone) {
        iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
        tlv::Tlv::Tlv((Tlv *)local_1e0,kCommissionerSessionId,(uint16_t)iVar2,kMeshCoP);
        AppendTlv((Error *)local_218,&request,(Tlv *)local_1e0);
        pEVar3 = Error::operator=(&error,(Error *)local_218);
        EVar1 = pEVar3->mCode;
        std::__cxx11::string::~string((string *)&local_210);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
        if (EVar1 == kNone) {
          MakeChannelMask((Error *)local_218,&channelMask,aChannelMask);
          pEVar3 = Error::operator=(&error,(Error *)local_218);
          EVar1 = pEVar3->mCode;
          std::__cxx11::string::~string((string *)&local_210);
          if (EVar1 == kNone) {
            tlv::Tlv::Tlv((Tlv *)local_1e0,kChannelMask,&channelMask,kMeshCoP);
            AppendTlv((Error *)local_218,&request,(Tlv *)local_1e0);
            pEVar3 = Error::operator=(&error,(Error *)local_218);
            EVar1 = pEVar3->mCode;
            std::__cxx11::string::~string((string *)&local_210);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_1d8);
            if (EVar1 == kNone) {
              tlv::Tlv::Tlv((Tlv *)local_1e0,kCount,aCount,kMeshCoP);
              AppendTlv((Error *)local_218,&request,(Tlv *)local_1e0);
              pEVar3 = Error::operator=(&error,(Error *)local_218);
              EVar1 = pEVar3->mCode;
              std::__cxx11::string::~string((string *)&local_210);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_1d8);
              if (EVar1 == kNone) {
                tlv::Tlv::Tlv((Tlv *)local_1e0,kPeriod,(uint16_t)local_1b4,kMeshCoP);
                AppendTlv((Error *)local_218,&request,(Tlv *)local_1e0);
                pEVar3 = Error::operator=(&error,(Error *)local_218);
                EVar1 = pEVar3->mCode;
                std::__cxx11::string::~string((string *)&local_210);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&local_1d8);
                if (EVar1 == kNone) {
                  tlv::Tlv::Tlv((Tlv *)local_1e0,kScanDuration,(uint16_t)local_1b8,kMeshCoP);
                  AppendTlv((Error *)local_218,&request,(Tlv *)local_1e0);
                  pEVar3 = Error::operator=(&error,(Error *)local_218);
                  EVar1 = pEVar3->mCode;
                  std::__cxx11::string::~string((string *)&local_210);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            (&local_1d8);
                  if (EVar1 == kNone) {
                    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
                    if ((char)iVar2 != '\0') {
                      SignRequest((Error *)local_218,this,&request,kMeshCoP,true);
                      pEVar3 = Error::operator=(&error,(Error *)local_218);
                      EVar1 = pEVar3->mCode;
                      std::__cxx11::string::~string((string *)&local_210);
                      if (EVar1 != kNone) goto LAB_00178d12;
                    }
                    local_138 = (code *)0x0;
                    pcStack_130 = (code *)0x0;
                    local_148._M_unused._M_object = (void *)0x0;
                    local_148._8_8_ = 0;
                    this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
                    std::function<void_(ot::commissioner::Error)>::function
                              (this_00,&onResponse.aHandler);
                    pcStack_130 = std::
                                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1265:23)>
                                  ::_M_invoke;
                    local_138 = std::
                                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1265:23)>
                                ::_M_manager;
                    local_148._M_unused._M_object = this_00;
                    ProxyClient::SendRequest
                              (&this->mProxyClient,&request,(ResponseHandler *)&local_148,&dstAddr,
                               0xf0bf);
                    std::_Function_base::~_Function_base((_Function_base *)&local_148);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00178d12:
  if ((error.mCode != kNone) || ((request.mHeader._0_1_ & 0xc) == 4)) {
    Error::Error((Error *)local_58,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::EnergyScan(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    Error         error;
    Address       dstAddr;
    ByteArray     channelMask;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    if (dstAddr.IsMulticast())
    {
        request.SetType(coap::Type::kNonConfirmable);
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtEdScan));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = MakeChannelMask(channelMask, aChannelMask));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kChannelMask, channelMask}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCount, aCount}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kPeriod, aPeriod}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kScanDuration, aScanDuration}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone || request.IsNonConfirmable())
    {
        aHandler(error);
    }
}